

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadPoseVertices(OgreBinarySerializer *this,Pose *pose)

{
  StreamReader<false,_false> *pSVar1;
  int8_t *piVar2;
  unsigned_short uVar3;
  uint uVar4;
  mapped_type *pmVar5;
  MemoryStreamReader *this_00;
  bool bVar6;
  Vertex v;
  uint local_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  pSVar1 = this->m_reader;
  if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
    uVar3 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
    uVar4 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar4;
    this_00 = this->m_reader;
    bVar6 = *(int *)&this_00->end == *(int *)&this_00->current;
    if (uVar3 == 0xc111 && !bVar6) {
      do {
        uStack_48 = 0;
        uStack_44 = 0;
        uStack_40 = 0;
        uStack_3c = 0;
        uStack_38 = 0;
        uStack_34 = 0;
        local_4c = StreamReader<false,_false>::Get<unsigned_int>(this_00);
        piVar2 = this->m_reader->current;
        StreamReader<false,_false>::SetPtr(this->m_reader,piVar2 + 0xc);
        uStack_40 = *(undefined4 *)(piVar2 + 8);
        uStack_48 = (undefined4)*(undefined8 *)piVar2;
        uStack_44 = (undefined4)((ulong)*(undefined8 *)piVar2 >> 0x20);
        if (pose->hasNormals == true) {
          piVar2 = this->m_reader->current;
          StreamReader<false,_false>::SetPtr(this->m_reader,piVar2 + 0xc);
          uStack_34 = *(undefined4 *)(piVar2 + 8);
          uStack_3c = (undefined4)*(undefined8 *)piVar2;
          uStack_38 = (undefined4)((ulong)*(undefined8 *)piVar2 >> 0x20);
        }
        pmVar5 = std::
                 map<unsigned_int,_Assimp::Ogre::Pose::Vertex,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::Ogre::Pose::Vertex>_>_>
                 ::operator[](&pose->vertices,&local_4c);
        *(ulong *)&(pmVar5->offset).z = CONCAT44(uStack_3c,uStack_40);
        (pmVar5->normal).y = (float)uStack_38;
        (pmVar5->normal).z = (float)uStack_34;
        pmVar5->index = local_4c;
        (pmVar5->offset).x = (float)uStack_48;
        (pmVar5->offset).y = (float)uStack_44;
        (pmVar5->offset).z = (float)uStack_40;
        pSVar1 = this->m_reader;
        if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
          uVar3 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
          uVar4 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          this->m_currentLen = uVar4;
        }
        this_00 = this->m_reader;
        bVar6 = *(int *)&this_00->end == *(int *)&this_00->current;
      } while ((!bVar6) && (uVar3 == 0xc111));
    }
    if (!bVar6) {
      StreamReader<false,_false>::IncPtr(this_00,-6);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadPoseVertices(Pose *pose)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() && id == M_POSE_VERTEX)
        {
            Pose::Vertex v;
            v.index = Read<uint32_t>();
            ReadVector(v.offset);
            if (pose->hasNormals)
                ReadVector(v.normal);

            pose->vertices[v.index] = v;

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}